

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::DirtyDefinition(Element *this,DirtyNodes dirty_nodes)

{
  DirtyNodes dirty_nodes_local;
  Element *this_local;
  
  if (dirty_nodes == Self) {
    this->field_0x17 = this->field_0x17 & 0xfd | 2;
  }
  else if ((dirty_nodes == SelfAndSiblings) &&
          (this->field_0x17 = this->field_0x17 & 0xfd | 2, this->parent != (Element *)0x0)) {
    this->parent->field_0x17 = this->parent->field_0x17 & 0xfb | 4;
  }
  return;
}

Assistant:

void Element::DirtyDefinition(DirtyNodes dirty_nodes)
{
	switch (dirty_nodes)
	{
	case DirtyNodes::Self: dirty_definition = true; break;
	case DirtyNodes::SelfAndSiblings:
		dirty_definition = true;
		if (parent)
			parent->dirty_child_definitions = true;
		break;
	}
}